

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall
fmt::v11::detail::do_format_decimal<char,unsigned__int128>
          (detail *this,char *out,unsigned___int128 value,int size)

{
  int iVar1;
  make_unsigned_t<int> mVar2;
  undefined8 in_RAX;
  int in_ECX;
  undefined4 in_register_00000014;
  ulong uVar3;
  undefined8 unaff_RBX;
  ulong uVar4;
  undefined1 auVar5 [16];
  
  uVar3 = CONCAT44(in_register_00000014,size);
  auVar5._8_8_ = unaff_RBX;
  auVar5._0_8_ = in_RAX;
  iVar1 = count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)auVar5);
  if (iVar1 <= in_ECX) {
    mVar2 = to_unsigned<int>(in_ECX);
    while( true ) {
      uVar4 = (ulong)(mVar2 - 2);
      if (uVar3 < (out < (char *)0x64)) break;
      auVar5 = __udivti3(out,uVar3,100,0);
      uVar3 = auVar5._8_8_;
      *(undefined2 *)(this + uVar4) =
           *(undefined2 *)
            (digits2(unsigned_long)::data + (long)(out + (long)auVar5._0_8_ * -100) * 2);
      out = auVar5._0_8_;
      mVar2 = mVar2 - 2;
    }
    if (uVar3 < (out < (char *)0xa)) {
      uVar4 = (ulong)(mVar2 - 1);
      this[uVar4] = (detail)((byte)out | 0x30);
    }
    else {
      *(undefined2 *)(this + uVar4) = *(undefined2 *)(digits2(unsigned_long)::data + (long)out * 2);
    }
    return (char *)(this + uVar4);
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O2/_deps/fmt-src/include/fmt/format.h"
              ,0x49d,"invalid digit count");
}

Assistant:

FMT_CONSTEXPR20 auto do_format_decimal(Char* out, UInt value, int size)
    -> Char* {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  unsigned n = to_unsigned(size);
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value % 100));
    value /= 100;
  }
  if (value >= 10) {
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value));
  } else {
    out[--n] = static_cast<Char>('0' + value);
  }
  return out + n;
}